

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cpp
# Opt level: O2

bool chatter::platform::SocketBind(Socket socket,HostAddress *address)

{
  uint16_t uVar1;
  int iVar2;
  sockaddr local_28;
  
  local_28.sa_data[6] = '\0';
  local_28.sa_data[7] = '\0';
  local_28.sa_data[8] = '\0';
  local_28.sa_data[9] = '\0';
  local_28.sa_data[10] = '\0';
  local_28.sa_data[0xb] = '\0';
  local_28.sa_data[0xc] = '\0';
  local_28.sa_data[0xd] = '\0';
  local_28.sa_family = 2;
  uVar1 = HostAddress::port(address);
  local_28.sa_data._0_2_ = uVar1 << 8 | uVar1 >> 8;
  local_28.sa_data._2_4_ = HostAddress::address(address);
  iVar2 = bind(socket,&local_28,0x10);
  return iVar2 == 0;
}

Assistant:

bool SocketBind(Socket socket, const HostAddress& address)
{
    struct sockaddr_in sin;
    int rc;

    memset(&sin, 0, sizeof(sin));

    sin.sin_family = AF_INET;
    sin.sin_port = HostToNet16(address.port());
    sin.sin_addr.s_addr = address.address();

    rc = bind(socket, (struct sockaddr *)&sin, sizeof(sin));
    return rc == 0 ? true : false;
}